

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O2

JDIMENSION get_word_rgb_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  J_COLOR_SPACE JVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  FILE *pFVar8;
  jpeg_error_mgr *pjVar9;
  ushort uVar10;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var11;
  JDIMENSION JVar12;
  JSAMPROW pJVar13;
  bool bVar14;
  
  pFVar8 = sinfo[1].input_file;
  uVar1 = *(uint *)&sinfo[1].buffer;
  JVar2 = cinfo->in_color_space;
  iVar3 = rgb_red[JVar2];
  iVar4 = rgb_green[JVar2];
  iVar5 = rgb_blue[JVar2];
  uVar6 = alpha_index[JVar2];
  iVar7 = rgb_pixelsize[JVar2];
  p_Var11 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
            fread(sinfo[1].start_input,1,(size_t)sinfo[1].finish_input,(FILE *)sinfo->input_file);
  if (p_Var11 != sinfo[1].finish_input) {
    pjVar9 = cinfo->err;
    pjVar9->msg_code = 0x2b;
    (*pjVar9->error_exit)((j_common_ptr)cinfo);
  }
  p_Var11 = sinfo[1].start_input;
  pJVar13 = *sinfo->buffer;
  JVar12 = cinfo->image_width;
  while (bVar14 = JVar12 != 0, JVar12 = JVar12 - 1, bVar14) {
    uVar10 = *(ushort *)p_Var11 << 8 | *(ushort *)p_Var11 >> 8;
    if (uVar1 < uVar10) {
      pjVar9 = cinfo->err;
      pjVar9->msg_code = 0x407;
      (*pjVar9->error_exit)((j_common_ptr)cinfo);
    }
    pJVar13[iVar3] = *(JSAMPLE *)((long)&pFVar8->_flags + (ulong)uVar10);
    uVar10 = *(ushort *)(p_Var11 + 2) << 8 | *(ushort *)(p_Var11 + 2) >> 8;
    if (uVar1 < uVar10) {
      pjVar9 = cinfo->err;
      pjVar9->msg_code = 0x407;
      (*pjVar9->error_exit)((j_common_ptr)cinfo);
    }
    pJVar13[iVar4] = *(JSAMPLE *)((long)&pFVar8->_flags + (ulong)uVar10);
    uVar10 = *(ushort *)(p_Var11 + 4) << 8 | *(ushort *)(p_Var11 + 4) >> 8;
    if (uVar1 < uVar10) {
      pjVar9 = cinfo->err;
      pjVar9->msg_code = 0x407;
      (*pjVar9->error_exit)((j_common_ptr)cinfo);
    }
    pJVar13[iVar5] = *(JSAMPLE *)((long)&pFVar8->_flags + (ulong)uVar10);
    if ((JVar2 & ~JCS_YCbCr) == JCS_EXT_RGBA) {
      pJVar13[uVar6] = 0xff;
    }
    pJVar13 = pJVar13 + iVar7;
    p_Var11 = p_Var11 + 6;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_word_rgb_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading raw-word-format PPM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  register JSAMPROW ptr;
  register U_CHAR *bufferptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;
  unsigned int maxval = source->maxval;
  register int rindex = rgb_red[cinfo->in_color_space];
  register int gindex = rgb_green[cinfo->in_color_space];
  register int bindex = rgb_blue[cinfo->in_color_space];
  register int aindex = alpha_index[cinfo->in_color_space];
  register int ps = rgb_pixelsize[cinfo->in_color_space];

  if (!ReadOK(source->pub.input_file, source->iobuffer, source->buffer_width))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  ptr = source->pub.buffer[0];
  bufferptr = source->iobuffer;
  for (col = cinfo->image_width; col > 0; col--) {
    register unsigned int temp;
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    ptr[rindex] = rescale[temp];
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    ptr[gindex] = rescale[temp];
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    ptr[bindex] = rescale[temp];
    if (aindex >= 0)
      ptr[aindex] = 0xFF;
    ptr += ps;
  }
  return 1;
}